

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O0

void __thiscall
utObjImportExport_issue1453_segfault_Test::TestBody(utObjImportExport_issue1453_segfault_Test *this)

{
  bool bVar1;
  size_t pLength;
  aiScene *rhs;
  char *pcVar2;
  AssertHelper local_50;
  Message local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  aiScene *scene;
  Importer myimporter;
  utObjImportExport_issue1453_segfault_Test *this_local;
  
  myimporter.pimpl = (ImporterPimpl *)this;
  Assimp::Importer::Importer((Importer *)&scene);
  pcVar2 = TestBody::ObjModel;
  pLength = strlen(TestBody::ObjModel);
  rhs = Assimp::Importer::ReadFileFromMemory((Importer *)&scene,pcVar2,pLength,0x400,"");
  testing::internal::EqHelper<true>::Compare<aiScene_const>
            ((EqHelper<true> *)local_40,"nullptr","scene",(Secret *)0x0,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x131,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  Assimp::Importer::~Importer((Importer *)&scene);
  return;
}

Assistant:

TEST_F( utObjImportExport, issue1453_segfault ) {
    static const char *ObjModel =
        "v  0.0  0.0  0.0\n"
        "v  0.0  0.0  1.0\n"
        "v  0.0  1.0  0.0\n"
        "v  0.0  1.0  1.0\n"
        "v  1.0  0.0  0.0\n"
        "v  1.0  0.0  1.0\n"
        "v  1.0  1.0  0.0\n"
        "v  1.0  1.0  1.0\nB";

    Assimp::Importer myimporter;
    const aiScene *scene = myimporter.ReadFileFromMemory( ObjModel, strlen(ObjModel), aiProcess_ValidateDataStructure );
    EXPECT_EQ( nullptr, scene );
}